

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_thread.cpp
# Opt level: O0

void __thiscall cooper::work_thread::thread_func(work_thread *this)

{
  bool bVar1;
  bool local_31;
  undefined1 local_18 [16];
  work_thread *this_local;
  
  local_18._8_8_ = this;
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->quit_);
    local_31 = false;
    if (bVar1) {
      local_31 = thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
                 ::empty(&this->que_);
    }
    if (((local_31 ^ 0xffU) & 1) == 0) break;
    thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
    ::get((thread_queue<cooper::func_wrapper,_std::deque<cooper::func_wrapper,_std::allocator<cooper::func_wrapper>_>_>
           *)local_18);
    func_wrapper::operator()((func_wrapper *)local_18);
    func_wrapper::~func_wrapper((func_wrapper *)local_18);
  }
  return;
}

Assistant:

void work_thread::thread_func()
{
	while (!(quit_ && que_.empty())) {
		try {
			que_.get()();
		}
		catch (...) {}
	}
}